

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcRootLogLikelihoodsMulti
          (BeagleCPU4StateImpl<double,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *scaleBufferIndices,int count,double *outSumLogLikelihood
          )

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  double *pdVar11;
  double *pdVar12;
  double **ppdVar13;
  bool bVar14;
  double *pdVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  int *piVar25;
  long lVar26;
  ulong uVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  vector<double,_std::allocator<double>_> maxScaleFactor;
  vector<int,_std::allocator<int>_> indexMaxScale;
  allocator_type local_b9;
  int *local_b8;
  double *local_b0;
  ulong local_a8;
  int *local_a0;
  int *local_98;
  long local_90;
  ulong local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  vector<double,_std::allocator<double>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  uVar23 = (ulong)(uint)count;
  local_b8 = bufferIndices;
  local_a0 = categoryWeightsIndices;
  local_98 = stateFrequenciesIndices;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,(long)(this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount,
             (allocator_type *)&local_60);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_60,(long)(this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount,&local_b9);
  local_a8 = uVar23;
  if (0 < count) {
    uVar27 = 0;
    local_88 = (ulong)(count - 1);
    uVar16 = (ulong)(uint)(this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount;
    piVar25 = local_b8;
    do {
      local_90 = (long)piVar25[uVar27];
      pdVar15 = (this->super_BeagleCPUImpl<double,_1,_0>).gPartials[local_90];
      local_b0 = (this->super_BeagleCPUImpl<double,_1,_0>).gStateFrequencies[local_98[uVar27]];
      uVar19 = 0;
      pdVar11 = (this->super_BeagleCPUImpl<double,_1,_0>).gCategoryWeights[local_a0[uVar27]];
      iVar17 = (int)uVar16;
      if (0 < iVar17) {
        dVar28 = *pdVar11;
        pdVar12 = (this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp;
        uVar21 = uVar16 & 0xffffffff;
        uVar19 = 0;
        do {
          pdVar12[uVar19] = dVar28 * pdVar15[uVar19];
          pdVar12[uVar19 + 1] = dVar28 * pdVar15[uVar19 + 1];
          pdVar12[uVar19 + 2] = dVar28 * pdVar15[uVar19 + 2];
          pdVar12[uVar19 + 3] = dVar28 * pdVar15[uVar19 + 3];
          uVar19 = uVar19 + 4;
          uVar20 = (int)uVar21 - 1;
          uVar21 = (ulong)uVar20;
        } while (uVar20 != 0);
      }
      lVar22 = (long)(this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
      if (1 < lVar22) {
        iVar10 = (this->super_BeagleCPUImpl<double,_1,_0>).kExtraPatterns;
        pdVar12 = (this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp;
        lVar24 = 1;
        do {
          iVar18 = (int)uVar19;
          if (0 < iVar17) {
            auVar29._8_8_ = 0;
            auVar29._0_8_ = pdVar11[lVar24];
            lVar26 = 0;
            uVar19 = uVar16 & 0xffffffff;
            do {
              auVar34._8_8_ = 0;
              auVar34._0_8_ = pdVar15[iVar18 + lVar26];
              auVar2._8_8_ = 0;
              auVar2._0_8_ = pdVar12[lVar26];
              auVar2 = vfmadd213sd_fma(auVar34,auVar29,auVar2);
              pdVar12[lVar26] = auVar2._0_8_;
              auVar35._8_8_ = 0;
              auVar35._0_8_ = pdVar15[(long)iVar18 + lVar26 + 1];
              auVar3._8_8_ = 0;
              auVar3._0_8_ = pdVar12[lVar26 + 1];
              auVar2 = vfmadd213sd_fma(auVar35,auVar29,auVar3);
              pdVar12[lVar26 + 1] = auVar2._0_8_;
              auVar36._8_8_ = 0;
              auVar36._0_8_ = pdVar15[(long)iVar18 + lVar26 + 2];
              auVar4._8_8_ = 0;
              auVar4._0_8_ = pdVar12[lVar26 + 2];
              auVar2 = vfmadd213sd_fma(auVar36,auVar29,auVar4);
              pdVar12[lVar26 + 2] = auVar2._0_8_;
              auVar37._8_8_ = 0;
              auVar37._0_8_ = pdVar15[(long)iVar18 + lVar26 + 3];
              auVar5._8_8_ = 0;
              auVar5._0_8_ = pdVar12[lVar26 + 3];
              auVar2 = vfmadd213sd_fma(auVar37,auVar29,auVar5);
              pdVar12[lVar26 + 3] = auVar2._0_8_;
              lVar26 = lVar26 + 4;
              uVar20 = (int)uVar19 - 1;
              uVar19 = (ulong)uVar20;
            } while (uVar20 != 0);
            iVar18 = iVar18 + (int)lVar26;
          }
          uVar19 = (ulong)(uint)(iVar18 + iVar10 * 4);
          lVar24 = lVar24 + 1;
        } while (lVar24 != lVar22);
      }
      piVar25 = local_b8;
      if (0 < iVar17) {
        lVar24 = 0;
        lVar22 = 0;
        local_70 = local_b0[1];
        local_68 = *local_b0;
        local_78 = local_b0[2];
        local_b0 = (double *)local_b0[3];
        do {
          pdVar15 = (this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp;
          auVar30._8_8_ = 0;
          auVar30._0_8_ = local_68;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = pdVar15[lVar24];
          auVar39._8_8_ = 0;
          auVar39._0_8_ = local_70 * pdVar15[lVar24 + 1];
          auVar29 = vfmadd231sd_fma(auVar39,auVar30,auVar6);
          auVar31._8_8_ = 0;
          auVar31._0_8_ = local_78;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = pdVar15[lVar24 + 2];
          auVar29 = vfmadd231sd_fma(auVar29,auVar31,auVar7);
          auVar32._8_8_ = 0;
          auVar32._0_8_ = local_b0;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = pdVar15[lVar24 + 3];
          auVar29 = vfmadd231sd_fma(auVar29,auVar32,auVar8);
          dVar28 = auVar29._0_8_;
          uVar20 = (uint)(this->super_BeagleCPUImpl<double,_1,_0>).kFlags;
          if (*scaleBufferIndices == -1) {
            if ((uVar20 >> 8 & 1) != 0) goto LAB_00125c07;
          }
          else {
            if ((uVar20 >> 8 & 1) == 0) {
              iVar17 = scaleBufferIndices[uVar27];
              bVar14 = true;
            }
            else {
LAB_00125c07:
              iVar17 = (int)local_90 - (this->super_BeagleCPUImpl<double,_1,_0>).kTipCount;
              bVar14 = false;
            }
            ppdVar13 = (this->super_BeagleCPUImpl<double,_1,_0>).gScaleBuffers;
            pdVar15 = ppdVar13[iVar17];
            if (uVar27 == 0) {
              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[lVar22] = 0;
              uVar16 = 0;
              dVar1 = pdVar15[lVar22];
              auVar33 = ZEXT864((ulong)dVar1);
              local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar22] = dVar1;
              if ((int)local_a8 != 1) {
                uVar19 = 1;
                uVar16 = 0;
                do {
                  if (bVar14) {
                    iVar17 = scaleBufferIndices[uVar19];
                  }
                  else {
                    iVar17 = piVar25[uVar19] - (this->super_BeagleCPUImpl<double,_1,_0>).kTipCount;
                  }
                  dVar1 = ppdVar13[iVar17][lVar22];
                  if (auVar33._0_8_ < dVar1) {
                    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar22] = (int)uVar19;
                    local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar22] = dVar1;
                    uVar16 = uVar19 & 0xffffffff;
                    auVar33 = ZEXT864((ulong)dVar1);
                  }
                  uVar19 = uVar19 + 1;
                } while (uVar23 != uVar19);
              }
            }
            else {
              uVar16 = (ulong)(uint)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[lVar22];
            }
            if (uVar27 != uVar16) {
              local_80 = dVar28;
              dVar28 = exp(pdVar15[lVar22] -
                           local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar22]);
              dVar28 = local_80 * dVar28;
              piVar25 = local_b8;
            }
          }
          pdVar15 = (this->super_BeagleCPUImpl<double,_1,_0>).outLogLikelihoodsTmp;
          if (uVar27 == 0) {
            pdVar15[lVar22] = dVar28;
          }
          else {
            dVar28 = dVar28 + pdVar15[lVar22];
            if (uVar27 == local_88) {
              dVar28 = log(dVar28);
              pdVar15 = (this->super_BeagleCPUImpl<double,_1,_0>).outLogLikelihoodsTmp;
              piVar25 = local_b8;
            }
            pdVar15[lVar22] = dVar28;
          }
          uVar16 = (ulong)(this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount;
          lVar24 = lVar24 + 4;
          lVar22 = lVar22 + 1;
        } while (lVar22 < (long)uVar16);
      }
      uVar27 = uVar27 + 1;
    } while (uVar27 != uVar23);
  }
  if (*scaleBufferIndices == -1) {
    uVar20 = (this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount;
    if (((this->super_BeagleCPUImpl<double,_1,_0>).kFlags & 0x100) != 0) goto LAB_00125d3a;
LAB_00125d69:
    *outSumLogLikelihood = 0.0;
    if (0 < (int)uVar20) {
      pdVar15 = (this->super_BeagleCPUImpl<double,_1,_0>).gPatternWeights;
      pdVar11 = (this->super_BeagleCPUImpl<double,_1,_0>).outLogLikelihoodsTmp;
      auVar29 = ZEXT816(0) << 0x40;
      uVar23 = 0;
      do {
        auVar38._8_8_ = 0;
        auVar38._0_8_ = pdVar11[uVar23];
        auVar9._8_8_ = 0;
        auVar9._0_8_ = pdVar15[uVar23];
        auVar29 = vfmadd231sd_fma(auVar29,auVar38,auVar9);
        uVar23 = uVar23 + 1;
        dVar28 = auVar29._0_8_;
        *outSumLogLikelihood = dVar28;
      } while (uVar20 != uVar23);
      iVar17 = (uint)(!NAN(dVar28) && !NAN(dVar28)) * 8 + -8;
      goto LAB_00125dbc;
    }
  }
  else {
    uVar20 = (this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount;
LAB_00125d3a:
    if (0 < (int)uVar20) {
      pdVar15 = (this->super_BeagleCPUImpl<double,_1,_0>).outLogLikelihoodsTmp;
      uVar23 = 0;
      do {
        pdVar15[uVar23] =
             local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar23] + pdVar15[uVar23];
        uVar23 = uVar23 + 1;
      } while (uVar20 != uVar23);
      goto LAB_00125d69;
    }
    *outSumLogLikelihood = 0.0;
  }
  iVar17 = 0;
LAB_00125dbc:
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return iVar17;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsMulti(const int* bufferIndices,
                                                                const int* categoryWeightsIndices,
                                                                const int* stateFrequenciesIndices,
                                                                const int* scaleBufferIndices,
                                                                int count,
                                                                double* outSumLogLikelihood) {

    int returnCode = BEAGLE_SUCCESS;

    std::vector<int> indexMaxScale(kPatternCount);
    std::vector<REALTYPE> maxScaleFactor(kPatternCount);

    for (int subsetIndex = 0 ; subsetIndex < count; ++subsetIndex ) {
        const int rootPartialIndex = bufferIndices[subsetIndex];
        const REALTYPE* rootPartials = gPartials[rootPartialIndex];
        const REALTYPE* frequencies = gStateFrequencies[stateFrequenciesIndices[subsetIndex]];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[subsetIndex]];
        int u = 0;
        int v = 0;

        const REALTYPE wt0 = wt[0];
        for (int k = 0; k < kPatternCount; k++) {
            integrationTmp[v    ] = rootPartials[v    ] * wt0;
            integrationTmp[v + 1] = rootPartials[v + 1] * wt0;
            integrationTmp[v + 2] = rootPartials[v + 2] * wt0;
            integrationTmp[v + 3] = rootPartials[v + 3] * wt0;
            v += 4;
        }
        for (int l = 1; l < kCategoryCount; l++) {
            u = 0;
            const REALTYPE wtl = wt[l];
            for (int k = 0; k < kPatternCount; k++) {
                integrationTmp[u    ] += rootPartials[v    ] * wtl;
                integrationTmp[u + 1] += rootPartials[v + 1] * wtl;
                integrationTmp[u + 2] += rootPartials[v + 2] * wtl;
                integrationTmp[u + 3] += rootPartials[v + 3] * wtl;

                u += 4;
                v += 4;
            }
            v += 4 * kExtraPatterns;
        }

        REALTYPE freq0, freq1, freq2, freq3;
        freq0 = frequencies[0];
        freq1 = frequencies[1];
        freq2 = frequencies[2];
        freq3 = frequencies[3];

        u = 0;
        for (int k = 0; k < kPatternCount; k++) {
            REALTYPE sum =
                freq0 * integrationTmp[u    ] +
                freq1 * integrationTmp[u + 1] +
                freq2 * integrationTmp[u + 2] +
                freq3 * integrationTmp[u + 3];

            u += 4;

            // TODO: allow only some subsets to have scale indices
            if (scaleBufferIndices[0] != BEAGLE_OP_NONE || (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)) {
                int cumulativeScalingFactorIndex;
                if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)
                    cumulativeScalingFactorIndex = rootPartialIndex - kTipCount;
                else
                    cumulativeScalingFactorIndex = scaleBufferIndices[subsetIndex];

                const REALTYPE* cumulativeScaleFactors = gScaleBuffers[cumulativeScalingFactorIndex];

                if (subsetIndex == 0) {
                    indexMaxScale[k] = 0;
                    maxScaleFactor[k] = cumulativeScaleFactors[k];
                    for (int j = 1; j < count; j++) {
                        REALTYPE tmpScaleFactor;
                        if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)
                            tmpScaleFactor = gScaleBuffers[bufferIndices[j] - kTipCount][k];
                        else
                            tmpScaleFactor = gScaleBuffers[scaleBufferIndices[j]][k];

                        if (tmpScaleFactor > maxScaleFactor[k]) {
                            indexMaxScale[k] = j;
                            maxScaleFactor[k] = tmpScaleFactor;
                        }
                    }
                }

                if (subsetIndex != indexMaxScale[k])
                    sum *= exp((REALTYPE)(cumulativeScaleFactors[k] - maxScaleFactor[k]));
            }

            if (subsetIndex == 0) {
                outLogLikelihoodsTmp[k] = sum;
            } else if (subsetIndex == count - 1) {
                REALTYPE tmpSum = outLogLikelihoodsTmp[k] + sum;

                outLogLikelihoodsTmp[k] = log(tmpSum);
            } else {
                outLogLikelihoodsTmp[k] += sum;
            }
        }
    }

    if (scaleBufferIndices[0] != BEAGLE_OP_NONE || (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)) {
        for(int i=0; i<kPatternCount; i++)
            outLogLikelihoodsTmp[i] += maxScaleFactor[i];
    }

    *outSumLogLikelihood = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;
}